

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_default_vfs_close(ma_vfs *pVFS,ma_vfs_file file)

{
  if (file != (ma_vfs_file)0x0) {
    fclose((FILE *)file);
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

static ma_result ma_default_vfs_close(ma_vfs* pVFS, ma_vfs_file file)
{
    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_close__win32(pVFS, file);
#else
    return ma_default_vfs_close__stdio(pVFS, file);
#endif
}